

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int iVar1;
  ImGuiListClipperData *pIVar2;
  undefined4 in_ESI;
  ImVector<ImGuiListClipperData> *in_RDI;
  undefined4 in_XMM0_Da;
  ImGuiListClipperData *data;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiListClipper *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined1 local_50 [40];
  ImGuiTable *local_28;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  local_28 = GImGui->CurrentTable;
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  if ((local_28 != (ImGuiTable *)0x0) && ((local_28->IsInsideRow & 1U) != 0)) {
    ImGui::TableEndRow(table);
  }
  in_RDI[1].Size = (int)(local_20->DC).CursorPos.y;
  *(undefined4 *)((long)&in_RDI->Data + 4) = local_10;
  *(undefined4 *)&in_RDI->Data = local_c;
  in_RDI->Size = -1;
  in_RDI->Capacity = 0;
  iVar1 = local_18->ClipperTempDataStacked + 1;
  local_18->ClipperTempDataStacked = iVar1;
  if ((local_18->ClipperTempData).Size < iVar1) {
    in_stack_ffffffffffffff78 = (ImGuiListClipper *)&local_18->ClipperTempData;
    in_stack_ffffffffffffff84 = local_18->ClipperTempDataStacked;
    iVar1 = (int)((ulong)local_50 >> 0x20);
    ImGuiListClipperData::ImGuiListClipperData
              ((ImGuiListClipperData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
              );
    ImVector<ImGuiListClipperData>::resize
              (in_RDI,iVar1,
               (ImGuiListClipperData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
              );
    ImGuiListClipperData::~ImGuiListClipperData((ImGuiListClipperData *)0x118757);
  }
  pIVar2 = ImVector<ImGuiListClipperData>::operator[]
                     (&local_18->ClipperTempData,local_18->ClipperTempDataStacked + -1);
  ImGuiListClipperData::Reset
            ((ImGuiListClipperData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  pIVar2->LossynessOffset = (local_20->DC).CursorStartPosLossyness.y;
  in_RDI[1].Data = pIVar2;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}